

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O1

int conjgrad_min_lin(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                    double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
                    double xtol,double *xf)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      xi[uVar2] = dx[uVar2] * xi[uVar2];
      dx[uVar2] = 1.0 / dx[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  iVar1 = cgpr_mt(funcpt,funcgrad,xi,N,dx,maxstep,MAXITER,niter,eps,gtol,ftol,xtol,xf);
  if (0 < N) {
    uVar2 = 0;
    do {
      xi[uVar2] = dx[uVar2] * xi[uVar2];
      dx[uVar2] = 1.0 / dx[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  return iVar1;
}

Assistant:

int conjgrad_min_lin(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf) {
	int rcode,i;
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 5.- Only First Strong Wolfe Condition Achieved (Using Conjugate Gradient Method)
	 * 
	 */ 

	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	//rcode = cgpc(xi,N,A,b,xf);
	//rcode = cgpr(funcpt,xi,N,dx,xf);// FR
	rcode = cgpr_mt(funcpt,funcgrad,xi,N,dx,maxstep,MAXITER,niter,eps,gtol,ftol,xtol,xf);//PR+

	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	
	return rcode;
}